

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

void Bac_ObjSetName(Bac_Ntk_t *p,int i,int x)

{
  int iVar1;
  
  iVar1 = Bac_ObjName(p,i);
  if (iVar1 == 0) {
    iVar1 = Bac_ObjIsCo(p,i);
    if (iVar1 == 0) {
      Vec_IntSetEntry(&p->vName,i,x);
      return;
    }
  }
  __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
}

Assistant:

static inline void           Bac_ObjSetName( Bac_Ntk_t * p, int i, int x )   { assert(Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)); Vec_IntSetEntry( &p->vName, i, x );   }